

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

void revert_cb(Fl_Widget *param_1,void *param_2)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  
  if (modflag != 0) {
    iVar2 = fl_choice("This user interface has been changed. Really revert?","Cancel","Revert",
                      (char *)0x0);
    if (iVar2 == 0) {
      return;
    }
  }
  undo_suspend();
  iVar2 = read_file(filename,0);
  undo_resume();
  pcVar1 = filename;
  if (iVar2 != 0) {
    set_modflag(0);
    undo_clear();
    return;
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  fl_message("Can\'t read %s: %s",pcVar1,pcVar4);
  return;
}

Assistant:

void revert_cb(Fl_Widget *,void *) {
  if (modflag) {
    if (!fl_choice("This user interface has been changed. Really revert?",
                   "Cancel", "Revert", NULL)) return;
  }
  undo_suspend();
  if (!read_file(filename, 0)) {
    undo_resume();
    fl_message("Can't read %s: %s", filename, strerror(errno));
    return;
  }
  undo_resume();
  set_modflag(0);
  undo_clear();
}